

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundingBoxHelpers.cpp
# Opt level: O3

void __thiscall
iDynTree::BoundingBoxProjectionConstraint::buildConstraintMatrix
          (BoundingBoxProjectionConstraint *this)

{
  Polygon2D *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  size_t sVar5;
  Vector2 *pVVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  double *pdVar10;
  ulong uVar11;
  
  this_00 = &this->projectedBoundingBox;
  sVar5 = Polygon2D::getNrOfVertices(this_00);
  iDynTree::MatrixDynSize::resize((ulong)&this->A,sVar5);
  Polygon2D::getNrOfVertices(this_00);
  iDynTree::VectorDynSize::resize((ulong)&this->b);
  sVar5 = Polygon2D::getNrOfVertices(this_00);
  if (sVar5 != 0) {
    sVar5 = 0;
    do {
      pVVar6 = Polygon2D::operator()(this_00,sVar5);
      dVar1 = pVVar6->m_data[0];
      dVar2 = pVVar6->m_data[1];
      sVar7 = Polygon2D::getNrOfVertices(this_00);
      if (sVar5 == sVar7 - 1) {
        pVVar6 = Polygon2D::operator()(this_00,0);
      }
      else {
        pVVar6 = Polygon2D::operator()(this_00,sVar5 + 1);
      }
      uVar11 = sVar5 + 1;
      dVar3 = pVVar6->m_data[0];
      dVar4 = pVVar6->m_data[1];
      lVar8 = iDynTree::MatrixDynSize::data();
      iDynTree::MatrixDynSize::rows();
      lVar9 = iDynTree::MatrixDynSize::cols();
      pdVar10 = (double *)(lVar8 + lVar9 * sVar5 * 8);
      *pdVar10 = dVar4 - dVar2;
      pdVar10[1] = dVar1 - dVar3;
      pdVar10 = (double *)iDynTree::VectorDynSize::operator()(&this->b,sVar5);
      *pdVar10 = dVar1 * dVar4 - dVar2 * dVar3;
      sVar7 = Polygon2D::getNrOfVertices(this_00);
      sVar5 = uVar11;
    } while (uVar11 < sVar7);
  }
  return;
}

Assistant:

void BoundingBoxProjectionConstraint::buildConstraintMatrix()
    {
        // The rows of the A matrix and of the b vector depends on the number of vertices in the convex hull
        A.resize(projectedBoundingBox.getNrOfVertices(),2);
        b.resize(projectedBoundingBox.getNrOfVertices());

        // We assume that the vertices in projectedBoundingBox are expressed in counter-clockwise order: this
        // is ensured by the structure of the Monotone Chain algorithm

        // Iterate on all line segments one by one
        for (size_t i=0; i < projectedBoundingBox.getNrOfVertices(); i++)
        {
            Vector2 p0 = projectedBoundingBox(i);
            Vector2 p1;

            if ( i != projectedBoundingBox.getNrOfVertices()-1 )
            {
                p1 = projectedBoundingBox(i+1);
            }
            else
            {
                // if we are using the last vertix, we build the line connecting it with the first vertex
                p1 = projectedBoundingBox(0);
            }

            toEigen(A).block<1,2>(i,0) = Eigen::Vector2d(p1(1)-p0(1),p0(0)-p1(0));
            b(i) = p0(0)*p1(1) - p1(0)*p0(1);
        }

        return;
    }